

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

shared_ptr<duckdb::PreparedStatementData,_true> __thiscall
duckdb::ClientContext::CreatePreparedStatementInternal
          (ClientContext *this,ClientContextLock *lock,string *query,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement,
          optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
          values)

{
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var1;
  undefined8 uVar2;
  ClientContext *this_00;
  bool is_explain_analyze_p;
  int iVar3;
  pointer pSVar4;
  QueryProfiler *this_01;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
  *puVar5;
  PreparedStatementData *pPVar6;
  pointer pLVar7;
  type binder;
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  idx_t extraout_RDX_01;
  idx_t extraout_RDX_02;
  idx_t iVar8;
  idx_t extraout_RDX_03;
  idx_t extraout_RDX_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX_05;
  _Head_base<0UL,_duckdb::PhysicalPlan_*,_false> __p;
  PhysicalPlanGenerator *plan_p;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
  *in_R9;
  __node_base *p_Var9;
  shared_ptr<duckdb::PreparedStatementData,_true> sVar10;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_2d0;
  undefined1 local_2c8 [15];
  StatementType statement_type;
  __node_base local_2b8;
  LogicalOperator *local_2b0;
  _Head_base<0UL,_duckdb::SQLStatement_*,_false> local_2a8;
  ClientContext *local_2a0;
  optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
  values_local;
  string local_290;
  PhysicalPlanGenerator physical_planner;
  Planner logical_planner;
  
  values_local.ptr = in_R9;
  pSVar4 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
           operator->((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                       *)values.ptr);
  statement_type = pSVar4->type;
  make_shared_ptr<duckdb::PreparedStatementData,duckdb::StatementType&>((StatementType *)this);
  local_2a0 = this;
  this_01 = QueryProfiler::Get((ClientContext *)lock);
  ::std::__cxx11::string::string((string *)&local_290,(string *)statement);
  is_explain_analyze_p = IsExplainAnalyze((SQLStatement *)((values.ptr)->_M_h)._M_buckets);
  QueryProfiler::StartQuery(this_01,&local_290,is_explain_analyze_p,true);
  ::std::__cxx11::string::~string((string *)&local_290);
  QueryProfiler::StartPhase(this_01,PLANNER);
  Planner::Planner(&logical_planner,(ClientContext *)lock);
  if (values_local.ptr !=
      (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
       *)0x0) {
    puVar5 = optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
             ::operator*(&values_local);
    p_Var9 = &(puVar5->_M_h)._M_before_begin;
    while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
      BoundParameterData::BoundParameterData
                ((BoundParameterData *)&physical_planner,(BoundParameterData *)(p_Var9 + 5));
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::BoundParameterData>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::BoundParameterData>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::__cxx11::string_const&,duckdb::BoundParameterData>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::BoundParameterData>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::BoundParameterData>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&logical_planner.parameter_data,p_Var9 + 1,&physical_planner);
      BoundParameterData::~BoundParameterData((BoundParameterData *)&physical_planner);
    }
  }
  local_2a8._M_head_impl = (SQLStatement *)((values.ptr)->_M_h)._M_buckets;
  ((values.ptr)->_M_h)._M_buckets = (__buckets_ptr)0x0;
  Planner::CreatePlan(&logical_planner,
                      (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                       *)&local_2a8);
  this_00 = local_2a0;
  if (local_2a8._M_head_impl != (SQLStatement *)0x0) {
    (*(code *)((__node_base_ptr)(local_2a8._M_head_impl)->_vptr_SQLStatement)[1]._M_nxt)();
  }
  local_2a8._M_head_impl = (SQLStatement *)0x0;
  QueryProfiler::EndPhase(this_01);
  local_2d0._M_head_impl =
       (LogicalOperator *)
       logical_planner.plan.
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  logical_planner.plan.
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
       (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
       (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
        )0x0;
  pPVar6 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->
                     ((shared_ptr<duckdb::PreparedStatementData,_true> *)this_00);
  StatementProperties::operator=(&pPVar6->properties,&logical_planner.properties);
  pPVar6 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->
                     ((shared_ptr<duckdb::PreparedStatementData,_true> *)this_00);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&pPVar6->names,
              &logical_planner.names.
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             );
  pPVar6 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->
                     ((shared_ptr<duckdb::PreparedStatementData,_true> *)this_00);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
            (&(pPVar6->types).
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
             &logical_planner.types.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  pPVar6 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->
                     ((shared_ptr<duckdb::PreparedStatementData,_true> *)this_00);
  __p._M_head_impl = (PhysicalPlan *)&logical_planner.value_map;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(&(pPVar6->value_map)._M_h,
              (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::BoundParameterData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)__p._M_head_impl);
  iVar8 = extraout_RDX;
  if (logical_planner.properties.bound_all_parameters != false) {
    if (*(char *)((long)&lock[0x1c].client_guard._M_device + 4) == '\x01') {
      pLVar7 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)&local_2d0);
      iVar3 = (*pLVar7->_vptr_LogicalOperator[10])(pLVar7);
      if ((char)iVar3 != '\0') {
        QueryProfiler::StartPhase(this_01,ALL_OPTIMIZERS);
        binder = shared_ptr<duckdb::Binder,_true>::operator*(&logical_planner.binder);
        Optimizer::Optimizer((Optimizer *)&physical_planner,binder,(ClientContext *)lock);
        local_2b0 = local_2d0._M_head_impl;
        local_2d0._M_head_impl = (LogicalOperator *)0x0;
        plan_p = &physical_planner;
        Optimizer::Optimize((Optimizer *)local_2c8,
                            (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                             *)plan_p);
        uVar2 = local_2c8._0_8_;
        _Var1._M_head_impl = local_2d0._M_head_impl;
        local_2c8._0_8_ =
             (__uniq_ptr_impl<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_>)0x0;
        local_2d0._M_head_impl = (LogicalOperator *)uVar2;
        iVar8 = extraout_RDX_00;
        if (_Var1._M_head_impl != (LogicalOperator *)0x0) {
          (*(_Var1._M_head_impl)->_vptr_LogicalOperator[1])();
          iVar8 = extraout_RDX_01;
          if ((_Head_base<0UL,_duckdb::PhysicalPlan_*,_false>)local_2c8._0_8_ !=
              (_Head_base<0UL,_duckdb::PhysicalPlan_*,_false>)0x0) {
            (*(code *)(((((weak_ptr<duckdb::ClientContext,_true> *)
                         &((ArenaAllocator *)local_2c8._0_8_)->allocator)->internal).
                        super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                      ->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
                      super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)();
            iVar8 = extraout_RDX_02;
          }
        }
        local_2c8._0_8_ = (ClientContext *)0x0;
        if (local_2b0 != (LogicalOperator *)0x0) {
          (*((ArenaAllocator *)&local_2b0->_vptr_LogicalOperator)->allocator->free_function)
                    ((PrivateAllocatorData *)local_2b0,(data_ptr_t)plan_p,iVar8);
        }
        local_2b0 = (LogicalOperator *)0x0;
        QueryProfiler::EndPhase(this_01);
        Optimizer::~Optimizer((Optimizer *)&physical_planner);
      }
    }
    QueryProfiler::StartPhase(this_01,PHYSICAL_PLANNER);
    PhysicalPlanGenerator::PhysicalPlanGenerator(&physical_planner,(ClientContext *)lock);
    local_2b8._M_nxt = (_Hash_node_base *)local_2d0._M_head_impl;
    local_2d0._M_head_impl = (LogicalOperator *)0x0;
    PhysicalPlanGenerator::Plan
              ((PhysicalPlanGenerator *)local_2c8,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)&physical_planner);
    pPVar6 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->
                       ((shared_ptr<duckdb::PreparedStatementData,_true> *)this_00);
    __p._M_head_impl = (PhysicalPlan *)local_2c8._0_8_;
    local_2c8._0_8_ =
         (__uniq_ptr_impl<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_>)0x0;
    ::std::__uniq_ptr_impl<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_>::reset
              ((__uniq_ptr_impl<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_> *)
               &pPVar6->physical_plan,__p._M_head_impl);
    ::std::unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_>::~unique_ptr
              ((unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_> *)
               local_2c8);
    if ((LogicalOperator *)local_2b8._M_nxt != (LogicalOperator *)0x0) {
      (*((ArenaAllocator *)&(local_2b8._M_nxt)->_M_nxt)->allocator->free_function)
                ((PrivateAllocatorData *)local_2b8._M_nxt,(data_ptr_t)__p._M_head_impl,
                 extraout_RDX_03);
    }
    local_2b8._M_nxt = (_Hash_node_base *)0x0;
    QueryProfiler::EndPhase(this_01);
    PhysicalPlanGenerator::~PhysicalPlanGenerator(&physical_planner);
    iVar8 = extraout_RDX_04;
  }
  if (local_2d0._M_head_impl != (LogicalOperator *)0x0) {
    (*((ArenaAllocator *)&(local_2d0._M_head_impl)->_vptr_LogicalOperator)->allocator->free_function
    )((PrivateAllocatorData *)local_2d0._M_head_impl,(data_ptr_t)__p._M_head_impl,iVar8);
  }
  Planner::~Planner(&logical_planner);
  sVar10.internal.super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX_05._M_pi;
  sVar10.internal.super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this_00;
  return (shared_ptr<duckdb::PreparedStatementData,_true>)
         sVar10.internal.
         super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<PreparedStatementData>
ClientContext::CreatePreparedStatementInternal(ClientContextLock &lock, const string &query,
                                               unique_ptr<SQLStatement> statement,
                                               optional_ptr<case_insensitive_map_t<BoundParameterData>> values) {
	StatementType statement_type = statement->type;
	auto result = make_shared_ptr<PreparedStatementData>(statement_type);

	auto &profiler = QueryProfiler::Get(*this);
	profiler.StartQuery(query, IsExplainAnalyze(statement.get()), true);
	profiler.StartPhase(MetricsType::PLANNER);
	Planner logical_planner(*this);
	if (values) {
		auto &parameter_values = *values;
		for (auto &value : parameter_values) {
			logical_planner.parameter_data.emplace(value.first, BoundParameterData(value.second));
		}
	}

	logical_planner.CreatePlan(std::move(statement));
	D_ASSERT(logical_planner.plan || !logical_planner.properties.bound_all_parameters);
	profiler.EndPhase();

	auto logical_plan = std::move(logical_planner.plan);
	// extract the result column names from the plan
	result->properties = logical_planner.properties;
	result->names = logical_planner.names;
	result->types = logical_planner.types;
	result->value_map = std::move(logical_planner.value_map);
	if (!logical_planner.properties.bound_all_parameters) {
		return result;
	}
#ifdef DEBUG
	logical_plan->Verify(*this);
#endif
	if (config.enable_optimizer && logical_plan->RequireOptimizer()) {
		profiler.StartPhase(MetricsType::ALL_OPTIMIZERS);
		Optimizer optimizer(*logical_planner.binder, *this);
		logical_plan = optimizer.Optimize(std::move(logical_plan));
		D_ASSERT(logical_plan);
		profiler.EndPhase();

#ifdef DEBUG
		logical_plan->Verify(*this);
#endif
	}

	// Convert the logical query plan into a physical query plan.
	profiler.StartPhase(MetricsType::PHYSICAL_PLANNER);
	PhysicalPlanGenerator physical_planner(*this);
	result->physical_plan = physical_planner.Plan(std::move(logical_plan));
	profiler.EndPhase();
	D_ASSERT(result->physical_plan);
	return result;
}